

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O0

ssize_t __thiscall Electron::VideoOutput::write(VideoOutput *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  uint uVar2;
  VideoOutput *extraout_RAX;
  VideoOutput *pVVar3;
  uint32_t *puVar4;
  uint64_t *puVar5;
  uint16_t *puVar6;
  uint8_t *target;
  int byte;
  uint8_t colour;
  int index;
  int registers [4] [4];
  uint8_t new_screen_mode;
  uint8_t value_local;
  int address_local;
  VideoOutput *this_local;
  
  registers[3][2]._3_1_ = (byte)__buf;
  uVar2 = __fd & 0xf;
  pVVar3 = (VideoOutput *)(ulong)(uVar2 - 0xf);
  if (uVar2 - 2 < 0xd || uVar2 - 0xf == 0) {
    pVVar3 = (VideoOutput *)
             ((long)&switchD_00724f99::switchdataD_00a50c70 +
             (long)(int)(&switchD_00724f99::switchdataD_00a50c70)[uVar2 - 2]);
    registers[3][3] = __fd;
    switch(uVar2) {
    case 0:
      this->start_screen_address_ =
           this->start_screen_address_ & 0xfe00 | (registers[3][2]._3_1_ & 0xe0) << 1;
      pVVar3 = this;
      if (this->start_screen_address_ == 0) {
        this->start_screen_address_ = this->start_screen_address_ | 0x8000;
      }
      break;
    case 1:
      this->start_screen_address_ =
           this->start_screen_address_ & 0x1ff | (registers[3][2]._3_1_ & 0x3f) << 9;
      pVVar3 = this;
      if (this->start_screen_address_ == 0) {
        this->start_screen_address_ = this->start_screen_address_ | 0x8000;
      }
      break;
    case 2:
    case 3:
    case 4:
      break;
    case 5:
      registers[3][2]._2_1_ = (byte)((int)(uint)registers[3][2]._3_1_ >> 3) & 7;
      if (registers[3][2]._2_1_ == 7) {
        registers[3][2]._2_1_ = 4;
      }
      pVVar3 = (VideoOutput *)(ulong)registers[3][2]._2_1_;
      if (registers[3][2]._2_1_ != this->screen_mode_) {
        this->screen_mode_ = registers[3][2]._2_1_;
        setup_base_address(this);
        pVVar3 = extraout_RAX;
      }
      break;
    default:
      memcpy(&stack0xffffffffffffffa8,&DAT_00a50cb0,0x40);
      uVar2 = registers[3][3] >> 1 & 3;
      bVar1 = registers[3][2]._3_1_ ^ 0xff;
      if ((registers[3][3] & 1U) == 0) {
        this->palette_[*(int *)(&stack0xffffffffffffffa8 + (long)(int)uVar2 * 0x10)] =
             this->palette_[*(int *)(&stack0xffffffffffffffa8 + (long)(int)uVar2 * 0x10)] & 6 |
             (byte)((int)(uint)bVar1 >> 7);
        this->palette_[registers[(long)(int)uVar2 + -1][3]] =
             this->palette_[registers[(long)(int)uVar2 + -1][3]] & 6 |
             (byte)((int)(uint)bVar1 >> 6) & 1;
        this->palette_[registers[(int)uVar2][0]] =
             this->palette_[registers[(int)uVar2][0]] & 6 | (byte)((int)(uint)bVar1 >> 5) & 1;
        this->palette_[registers[(int)uVar2][1]] =
             this->palette_[registers[(int)uVar2][1]] & 6 | (byte)((int)(uint)bVar1 >> 4) & 1;
        this->palette_[*(int *)(&stack0xffffffffffffffa8 + (long)(int)uVar2 * 0x10)] =
             this->palette_[*(int *)(&stack0xffffffffffffffa8 + (long)(int)uVar2 * 0x10)] & 5 |
             (byte)((int)(uint)bVar1 >> 2) & 2;
        this->palette_[registers[(long)(int)uVar2 + -1][3]] =
             this->palette_[registers[(long)(int)uVar2 + -1][3]] & 5 |
             (byte)((int)(uint)bVar1 >> 1) & 2;
      }
      else {
        this->palette_[*(int *)(&stack0xffffffffffffffa8 + (long)(int)uVar2 * 0x10)] =
             this->palette_[*(int *)(&stack0xffffffffffffffa8 + (long)(int)uVar2 * 0x10)] & 3 |
             (byte)((int)(uint)bVar1 >> 1) & 4;
        this->palette_[registers[(long)(int)uVar2 + -1][3]] =
             this->palette_[registers[(long)(int)uVar2 + -1][3]] & 3 | bVar1 & 4;
        this->palette_[registers[(int)uVar2][0]] =
             this->palette_[registers[(int)uVar2][0]] & 3 | (bVar1 & 2) << 1;
        this->palette_[registers[(int)uVar2][1]] =
             this->palette_[registers[(int)uVar2][1]] & 3 | (bVar1 & 1) << 2;
        this->palette_[registers[(int)uVar2][0]] =
             this->palette_[registers[(int)uVar2][0]] & 5 | (byte)((int)(uint)bVar1 >> 4) & 2;
        this->palette_[registers[(int)uVar2][1]] =
             this->palette_[registers[(int)uVar2][1]] & 5 | (byte)((int)(uint)bVar1 >> 3) & 2;
      }
      target._4_4_ = 0;
      pVVar3 = this;
      while ((int)target._4_4_ < 0x100) {
        puVar4 = (this->palette_tables_).forty1bpp + (int)target._4_4_;
        *(uint8_t *)puVar4 = this->palette_[(int)(target._4_4_ & 0x80) >> 4];
        *(uint8_t *)((long)puVar4 + 1) = this->palette_[(int)(target._4_4_ & 0x40) >> 3];
        *(uint8_t *)((long)puVar4 + 2) = this->palette_[(int)(target._4_4_ & 0x20) >> 2];
        *(uint8_t *)((long)puVar4 + 3) = this->palette_[(int)(target._4_4_ & 0x10) >> 1];
        puVar4 = (this->palette_tables_).eighty2bpp + (int)target._4_4_;
        *(uint8_t *)puVar4 =
             this->palette_[(int)(target._4_4_ & 0x80) >> 4 | (int)(target._4_4_ & 8) >> 2];
        *(uint8_t *)((long)puVar4 + 1) =
             this->palette_[(int)(target._4_4_ & 0x40) >> 3 | (int)(target._4_4_ & 4) >> 1];
        *(uint8_t *)((long)puVar4 + 2) =
             this->palette_[(int)((int)(target._4_4_ & 0x20) >> 2 | target._4_4_ & 2)];
        *(uint8_t *)((long)puVar4 + 3) =
             this->palette_[(int)((int)(target._4_4_ & 0x10) >> 1 | (target._4_4_ & 1) << 1)];
        puVar5 = (this->palette_tables_).eighty1bpp + (int)target._4_4_;
        *(uint8_t *)puVar5 = this->palette_[(int)(target._4_4_ & 0x80) >> 4];
        *(uint8_t *)((long)puVar5 + 1) = this->palette_[(int)(target._4_4_ & 0x40) >> 3];
        *(uint8_t *)((long)puVar5 + 2) = this->palette_[(int)(target._4_4_ & 0x20) >> 2];
        *(uint8_t *)((long)puVar5 + 3) = this->palette_[(int)(target._4_4_ & 0x10) >> 1];
        *(uint8_t *)((long)puVar5 + 4) = this->palette_[(int)(target._4_4_ & 8)];
        *(uint8_t *)((long)puVar5 + 5) = this->palette_[(int)((target._4_4_ & 4) << 1)];
        *(uint8_t *)((long)puVar5 + 6) = this->palette_[(int)((target._4_4_ & 2) << 2)];
        *(uint8_t *)((long)puVar5 + 7) = this->palette_[(int)((target._4_4_ & 1) << 3)];
        puVar6 = (this->palette_tables_).forty2bpp + (int)target._4_4_;
        *(uint8_t *)puVar6 =
             this->palette_[(int)(target._4_4_ & 0x80) >> 4 | (int)(target._4_4_ & 8) >> 2];
        *(uint8_t *)((long)puVar6 + 1) =
             this->palette_[(int)(target._4_4_ & 0x40) >> 3 | (int)(target._4_4_ & 4) >> 1];
        puVar6 = (this->palette_tables_).eighty4bpp + (int)target._4_4_;
        *(uint8_t *)puVar6 =
             this->palette_
             [(int)(target._4_4_ & 0x80) >> 4 | (int)(target._4_4_ & 0x20) >> 3 |
              (int)(target._4_4_ & 8) >> 2 | (int)(target._4_4_ & 2) >> 1];
        *(uint8_t *)((long)puVar6 + 1) =
             this->palette_
             [(int)((int)(target._4_4_ & 0x40) >> 3 | (int)(target._4_4_ & 0x10) >> 2 |
                    (int)(target._4_4_ & 4) >> 1 | target._4_4_ & 1)];
        target._4_4_ = target._4_4_ + 1;
        pVVar3 = (VideoOutput *)(ulong)target._4_4_;
      }
    }
  }
  return (ssize_t)pVVar3;
}

Assistant:

void VideoOutput::write(int address, uint8_t value) {
	switch(address & 0xf) {
		case 0x02:
			start_screen_address_ = (start_screen_address_ & 0xfe00) | uint16_t((value & 0xe0) << 1);
			if(!start_screen_address_) start_screen_address_ |= 0x8000;
		break;
		case 0x03:
			start_screen_address_ = (start_screen_address_ & 0x01ff) | uint16_t((value & 0x3f) << 9);
			if(!start_screen_address_) start_screen_address_ |= 0x8000;
		break;
		case 0x07: {
			// update screen mode
			uint8_t new_screen_mode = (value >> 3)&7;
			if(new_screen_mode == 7) new_screen_mode = 4;
			if(new_screen_mode != screen_mode_) {
				screen_mode_ = new_screen_mode;
				setup_base_address();
			}
		}
		break;
		case 0x08: case 0x09: case 0x0a: case 0x0b:
		case 0x0c: case 0x0d: case 0x0e: case 0x0f: {
			constexpr int registers[4][4] = {
				{10, 8, 2, 0},
				{14, 12, 6, 4},
				{15, 13, 7, 5},
				{11, 9, 3, 1},
			};
			const int index = (address >> 1)&3;
			const uint8_t colour = ~value;
			if(address&1) {
				palette_[registers[index][0]]	= (palette_[registers[index][0]]&3)	| ((colour >> 1)&4);
				palette_[registers[index][1]]	= (palette_[registers[index][1]]&3)	| ((colour >> 0)&4);
				palette_[registers[index][2]]	= (palette_[registers[index][2]]&3)	| ((colour << 1)&4);
				palette_[registers[index][3]]	= (palette_[registers[index][3]]&3)	| ((colour << 2)&4);

				palette_[registers[index][2]]	= (palette_[registers[index][2]]&5)	| ((colour >> 4)&2);
				palette_[registers[index][3]]	= (palette_[registers[index][3]]&5)	| ((colour >> 3)&2);
			} else {
				palette_[registers[index][0]]	= (palette_[registers[index][0]]&6)	| ((colour >> 7)&1);
				palette_[registers[index][1]]	= (palette_[registers[index][1]]&6)	| ((colour >> 6)&1);
				palette_[registers[index][2]]	= (palette_[registers[index][2]]&6)	| ((colour >> 5)&1);
				palette_[registers[index][3]]	= (palette_[registers[index][3]]&6)	| ((colour >> 4)&1);

				palette_[registers[index][0]]	= (palette_[registers[index][0]]&5)	| ((colour >> 2)&2);
				palette_[registers[index][1]]	= (palette_[registers[index][1]]&5)	| ((colour >> 1)&2);
			}

			// regenerate all palette tables for now
			for(int byte = 0; byte < 256; byte++) {
				uint8_t *target = reinterpret_cast<uint8_t *>(&palette_tables_.forty1bpp[byte]);
				target[0] = palette_[(byte&0x80) >> 4];
				target[1] = palette_[(byte&0x40) >> 3];
				target[2] = palette_[(byte&0x20) >> 2];
				target[3] = palette_[(byte&0x10) >> 1];

				target = reinterpret_cast<uint8_t *>(&palette_tables_.eighty2bpp[byte]);
				target[0] = palette_[((byte&0x80) >> 4) | ((byte&0x08) >> 2)];
				target[1] = palette_[((byte&0x40) >> 3) | ((byte&0x04) >> 1)];
				target[2] = palette_[((byte&0x20) >> 2) | ((byte&0x02) >> 0)];
				target[3] = palette_[((byte&0x10) >> 1) | ((byte&0x01) << 1)];

				target = reinterpret_cast<uint8_t *>(&palette_tables_.eighty1bpp[byte]);
				target[0] = palette_[(byte&0x80) >> 4];
				target[1] = palette_[(byte&0x40) >> 3];
				target[2] = palette_[(byte&0x20) >> 2];
				target[3] = palette_[(byte&0x10) >> 1];
				target[4] = palette_[(byte&0x08) >> 0];
				target[5] = palette_[(byte&0x04) << 1];
				target[6] = palette_[(byte&0x02) << 2];
				target[7] = palette_[(byte&0x01) << 3];

				target = reinterpret_cast<uint8_t *>(&palette_tables_.forty2bpp[byte]);
				target[0] = palette_[((byte&0x80) >> 4) | ((byte&0x08) >> 2)];
				target[1] = palette_[((byte&0x40) >> 3) | ((byte&0x04) >> 1)];

				target = reinterpret_cast<uint8_t *>(&palette_tables_.eighty4bpp[byte]);
				target[0] = palette_[((byte&0x80) >> 4) | ((byte&0x20) >> 3) | ((byte&0x08) >> 2) | ((byte&0x02) >> 1)];
				target[1] = palette_[((byte&0x40) >> 3) | ((byte&0x10) >> 2) | ((byte&0x04) >> 1) | ((byte&0x01) >> 0)];
			}
		}
		break;
	}
}